

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall dh::analysis::genMidCode(analysis *this)

{
  _Alloc_hider _Var1;
  ostream *poVar2;
  allocator local_72;
  allocator local_71;
  string local_70;
  string local_50;
  
  if (this->initFlag == true) {
    while( true ) {
      symTab::get_upptr_tab((symTab *)&local_70);
      _Var1._M_p = local_70._M_dataplus._M_p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length);
      if (_Var1._M_p == (pointer)0x0) break;
      symTab::get_upptr_tab((symTab *)&local_70);
      std::__shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2> *)&local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length);
    }
    std::__cxx11::string::string((string *)&local_70,"",&local_71);
    std::__cxx11::string::string((string *)&local_50,"",&local_72);
    genMidCode(this,&this->_root,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    this->genFlag = true;
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"[Fatal] SynTree not ready");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

void analysis::genMidCode()
{
	if ( !initFlag)
	{
		::std::cerr << "[Fatal] SynTree not ready" << ::std::endl;
		::std::exit(1);
	}

	while ( current_tab->get_upptr_tab() != nullptr)
	{
		current_tab = current_tab->get_upptr_tab();
	}
	genMidCode( _root, "", "");
	genFlag = true;
}